

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O0

void __thiscall OIDType::OIDType(OIDType *this,string *value)

{
  bool bVar1;
  string *value_local;
  OIDType *this_local;
  
  BER_CONTAINER::BER_CONTAINER(&this->super_BER_CONTAINER,OID);
  (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OIDType_0013c658;
  this->valid = false;
  std::__cxx11::string::string((string *)&this->_value,(string *)value);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data);
  bVar1 = generateInternalData(this);
  this->valid = bVar1;
  return;
}

Assistant:

explicit OIDType(const std::string& value): BER_CONTAINER(OID), _value(value) {
        // When creating a user OID, we generate our data vector immediately
        this->valid = this->generateInternalData();
    }